

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O3

void dumpObject(object *obj,int indent)

{
  object *poVar1;
  object **ppoVar2;
  object *poVar3;
  
  if (0 < indent) {
    do {
      fputc(0x20,_stderr);
      indent = indent + -1;
    } while (indent != 0);
  }
  ppoVar2 = &SmallIntClass;
  if (((ulong)obj & 1) == 0) {
    ppoVar2 = &obj->class;
  }
  poVar1 = *ppoVar2;
  if (poVar1 == SmallIntClass) {
    dumpObject_cold_7();
  }
  else {
    poVar3 = SmallIntClass;
    if (((ulong)obj & 1) == 0) {
      poVar3 = obj->class;
    }
    if (poVar3 == UndefinedClass) {
      dumpObject_cold_6();
    }
    else if (poVar1 == SymbolClass) {
      dumpObject_cold_5();
    }
    else if (poVar1 == StringClass) {
      dumpObject_cold_4();
    }
    else if (poVar1 == ArrayClass) {
      dumpObject_cold_3();
    }
    else if ((obj->header & 2) == 0) {
      dumpObject_cold_2();
    }
    else {
      dumpObject_cold_1();
    }
  }
  return;
}

Assistant:

void dumpObject(struct object *obj, int indent)
{
    for(int i=0; i < indent; i++) {
        fputc(' ', stderr);
    }

    if(CLASS(obj) == SmallIntClass) {
        fprintf(stderr, "%d", integerValue(obj));
    } else if(CLASS(obj) == UndefinedClass) {
        fprintf(stderr, "nil");
    } else if(CLASS(obj) == SymbolClass) {
        fprintf(stderr, "#%.*s", SIZE(obj), (char *)bytePtr(obj));
    } else if(CLASS(obj) == StringClass) {
        fprintf(stderr, "'%.*s'", SIZE(obj), (char *)bytePtr(obj));
    } else if(CLASS(obj) == ArrayClass) {
        fprintf(stderr, "#(");
        for(int i=0; i < (int)SIZE(obj); i++) {
            dumpObject(obj->data[i], 1);
        }
        fprintf(stderr, " )");
    } else if(IS_BINOBJ(obj)) {
        fprintf(stderr, "%.*s #(", SIZE(obj->class->data[nameInClass]), (char *)bytePtr(obj->class->data[nameInClass]));
        for(int i=0; i < (int)SIZE(obj); i++) {
            fprintf(stderr," %02x", bytePtr(obj)[i]);
        }
        fprintf(stderr, " )");
    } else {
        struct object *cls = CLASS(obj);
        struct object *name = cls->data[nameInClass];

        fprintf(stderr, "%.*s", SIZE(name), (char *)bytePtr(name));
    }
}